

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O3

FT_Error cff_parse_blend(CFF_Parser parser)

{
  FT_UInt vsindex;
  FT_UInt lenNDV;
  void *pvVar1;
  long lVar2;
  FT_Fixed *NDV;
  FT_Byte *pFVar3;
  FT_Byte *pFVar4;
  FT_Byte *pFVar5;
  long lVar6;
  undefined1 *puVar7;
  FT_Bool FVar8;
  FT_Error FVar9;
  uint uVar10;
  FT_PtrDist offset;
  ulong uVar11;
  FT_Pointer pvVar12;
  FT_Long FVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  FT_Byte **ppFVar17;
  ulong uVar18;
  int iVar19;
  FT_Byte **ppFVar20;
  CFF_Parser pCVar21;
  uint uVar22;
  long lVar23;
  FT_Error local_3c;
  CFF_Parser pCStack_38;
  FT_Error error;
  
  pvVar1 = parser->object;
  if (pvVar1 == (void *)0x0) {
    return 3;
  }
  lVar2 = *(long *)((long)pvVar1 + 0x2d0);
  if (lVar2 == 0) {
    return 3;
  }
  vsindex = *(FT_UInt *)((long)pvVar1 + 0x2c8);
  lenNDV = *(FT_UInt *)(lVar2 + 0x450);
  NDV = *(FT_Fixed **)(lVar2 + 0x458);
  pCStack_38 = parser;
  FVar8 = cff_blend_check_vector((CFF_Blend)(lVar2 + 0x420),vsindex,lenNDV,NDV);
  if ((FVar8 != '\0') &&
     (FVar9 = cff_blend_build_vector((CFF_Blend)(lVar2 + 0x420),vsindex,lenNDV,NDV), FVar9 != 0)) {
    return FVar9;
  }
  pCVar21 = pCStack_38;
  uVar11 = cff_parse_num(pCStack_38,(FT_Byte **)pCStack_38->top[-1]);
  uVar22 = (uint)uVar11;
  if (pCVar21->stackSize < uVar22) {
    return 3;
  }
  local_3c = 0;
  uVar10 = *(int *)(lVar2 + 0x440) * uVar22;
  uVar14 = (uint)((ulong)((long)pCStack_38->top + (-8 - (long)pCStack_38->stack)) >> 3);
  iVar16 = uVar14 - uVar10;
  FVar9 = 0xa1;
  if (uVar10 <= uVar14) {
    iVar19 = uVar22 * 5;
    uVar10 = *(uint *)(lVar2 + 0x470);
    uVar14 = *(uint *)(lVar2 + 0x474);
    if (uVar14 < uVar10 + iVar19) {
      pFVar3 = *(FT_Byte **)(lVar2 + 0x460);
      pFVar4 = *(FT_Byte **)(lVar2 + 0x468);
      pvVar12 = ft_mem_realloc(*(FT_Memory *)(*(long *)(lVar2 + 0x428) + 0x10),1,(ulong)uVar14,
                               (ulong)(uVar14 + iVar19),pFVar3,&local_3c);
      *(FT_Pointer *)(lVar2 + 0x460) = pvVar12;
      FVar9 = local_3c;
      if (local_3c != 0) goto LAB_001fc778;
      uVar10 = *(uint *)(lVar2 + 0x470);
      *(ulong *)(lVar2 + 0x468) = (ulong)uVar10 + (long)pvVar12;
      *(int *)(lVar2 + 0x474) = *(int *)(lVar2 + 0x474) + iVar19;
      if ((pFVar3 != (FT_Byte *)0x0) && ((long)pvVar12 - (long)pFVar3 != 0)) {
        ppFVar20 = pCStack_38->top;
        for (ppFVar17 = pCStack_38->stack; ppFVar17 < ppFVar20; ppFVar17 = ppFVar17 + 1) {
          pFVar5 = *ppFVar17;
          if ((pFVar3 <= pFVar5) && (pFVar5 < pFVar4)) {
            *ppFVar17 = pFVar5 + ((long)pvVar12 - (long)pFVar3);
            ppFVar20 = pCStack_38->top;
          }
        }
      }
    }
    *(uint *)(lVar2 + 0x470) = uVar10 + iVar19;
    uVar10 = iVar16 + uVar22;
    if (uVar22 == 0) {
      pCVar21 = pCStack_38;
      FVar9 = 0;
    }
    else {
      uVar18 = 0;
      pCVar21 = pCStack_38;
      uVar22 = uVar10;
      do {
        lVar6 = *(long *)(lVar2 + 0x448);
        uVar14 = iVar16 + (int)uVar18;
        FVar13 = cff_parse_num(pCVar21,(FT_Byte **)pCVar21->stack[uVar14]);
        pCVar21 = pCStack_38;
        iVar19 = (int)FVar13 << 0x10;
        if (1 < *(uint *)(lVar2 + 0x440)) {
          lVar23 = 1;
          do {
            uVar15 = (ulong)uVar22;
            uVar22 = uVar22 + 1;
            FVar13 = cff_parse_num(pCVar21,(FT_Byte **)pCVar21->stack[uVar15]);
            iVar19 = iVar19 + (int)FVar13 * *(int *)(lVar6 + lVar23 * 4);
            lVar23 = lVar23 + 1;
          } while ((uint)lVar23 < *(uint *)(lVar2 + 0x440));
        }
        pFVar3 = *(FT_Byte **)(lVar2 + 0x468);
        pCVar21->stack[uVar14] = pFVar3;
        *(FT_Byte **)(lVar2 + 0x468) = pFVar3 + 1;
        *pFVar3 = 0xff;
        puVar7 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar7 + 1;
        *puVar7 = (char)((uint)iVar19 >> 0x18);
        puVar7 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar7 + 1;
        *puVar7 = (char)((uint)iVar19 >> 0x10);
        puVar7 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar7 + 1;
        *puVar7 = (char)((uint)iVar19 >> 8);
        puVar7 = *(undefined1 **)(lVar2 + 0x468);
        *(undefined1 **)(lVar2 + 0x468) = puVar7 + 1;
        *puVar7 = (char)iVar19;
        uVar18 = uVar18 + 1;
        FVar9 = local_3c;
      } while (uVar18 != (uVar11 & 0xffffffff));
    }
    pCVar21->top = pCVar21->stack + uVar10;
  }
LAB_001fc778:
  *(undefined1 *)(lVar2 + 0x421) = 1;
  return FVar9;
}

Assistant:

static FT_Error
  cff_parse_blend( CFF_Parser  parser )
  {
    /* blend operator can only be used in a Private DICT */
    CFF_Private  priv = (CFF_Private)parser->object;
    CFF_SubFont  subFont;
    CFF_Blend    blend;
    FT_UInt      numBlends;
    FT_Error     error;


    if ( !priv || !priv->subfont )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    subFont = priv->subfont;
    blend   = &subFont->blend;

    if ( cff_blend_check_vector( blend,
                                 priv->vsindex,
                                 subFont->lenNDV,
                                 subFont->NDV ) )
    {
      error = cff_blend_build_vector( blend,
                                      priv->vsindex,
                                      subFont->lenNDV,
                                      subFont->NDV );
      if ( error )
        goto Exit;
    }

    numBlends = (FT_UInt)cff_parse_num( parser, parser->top - 1 );
    if ( numBlends > parser->stackSize )
    {
      FT_ERROR(( "cff_parse_blend: Invalid number of blends\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    FT_TRACE4(( "   %d value%s blended\n",
                numBlends,
                numBlends == 1 ? "" : "s" ));

    error = cff_blend_doBlend( subFont, parser, numBlends );

    blend->usedBV = TRUE;

  Exit:
    return error;
  }